

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

void __thiscall PDA::toDot(PDA *this,string *filename)

{
  State *pSVar1;
  bool bVar2;
  Node *this_00;
  pointer ppSVar3;
  pointer ppTVar4;
  string connectionString;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string *local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  Graph local_328;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  Connection local_270;
  Node local_210;
  Connection local_190;
  Node local_130;
  Node local_b0;
  
  local_328.rankdir._M_dataplus._M_p = (pointer)&local_328.rankdir.field_2;
  local_328.rankdir._M_string_length = 0;
  local_328.rankdir.field_2._8_8_ = 0;
  local_328.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_328.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.rankdir.field_2._M_allocated_capacity = 0;
  local_3c8 = filename;
  for (ppSVar3 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar3 !=
      (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar3 = ppSVar3 + 1) {
    bVar2 = isEndState(this,*ppSVar3);
    pSVar1 = *ppSVar3;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"doublecircle",(allocator<char> *)&local_408);
      Node::Node(&local_b0,&pSVar1->name,&pSVar1->name,&local_428);
      Graph::addNode(&local_328,&local_b0);
      this_00 = &local_b0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"circle",(allocator<char> *)&local_408);
      Node::Node(&local_130,&pSVar1->name,&pSVar1->name,&local_428);
      Graph::addNode(&local_328,&local_130);
      this_00 = &local_130;
    }
    Node::~Node(this_00);
    std::__cxx11::string::~string((string *)&local_428);
  }
  for (ppTVar4 = (this->transitionFunctionD).
                 super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar4 !=
      (this->transitionFunctionD).super__Vector_base<Transition_*,_std::allocator<Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar4 = ppTVar4 + 1) {
    toString_abi_cxx11_(&local_3a0,(*ppTVar4)->input);
    std::operator+(&local_290,"\"(",&local_3a0);
    std::operator+(&local_380,&local_290,", ");
    std::__cxx11::string::string((string *)&local_2b0,(string *)&(*ppTVar4)->stackInput);
    std::operator+(&local_3c0,&local_380,&local_2b0);
    std::operator+(&local_3e8,&local_3c0,"/");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_340,&(*ppTVar4)->stackPush);
    toString(&local_2d0,&local_340);
    std::operator+(&local_408,&local_3e8,&local_2d0);
    std::operator+(&local_428,&local_408,")\"");
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_340);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_3a0);
    Connection::Connection
              (&local_190,&(*ppTVar4)->stateFrom->name,&(*ppTVar4)->stateTo->name,&local_428);
    Graph::addConnection(&local_328,&local_190);
    Connection::~Connection(&local_190);
    std::__cxx11::string::~string((string *)&local_428);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"invis",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"invis",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"circle",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"style=invis",(allocator<char> *)&local_2b0);
  Node::Node(&local_210,&local_428,&local_408,&local_3e8,&local_3c0);
  Graph::addNode(&local_328,&local_210);
  Node::~Node(&local_210);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"invis",(allocator<char> *)&local_3e8);
  pSVar1 = this->startState;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"Start",(allocator<char> *)&local_3c0);
  Connection::Connection(&local_270,&local_428,&pSVar1->name,&local_408);
  Graph::addConnection(&local_328,&local_270);
  Connection::~Connection(&local_270);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::string((string *)&local_360,(string *)local_3c8);
  Graph::build_file(&local_328,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  Graph::~Graph(&local_328);
  return;
}

Assistant:

void PDA::toDot(std::string filename) {
    Graph graph = Graph();
    for (vector<State *>::iterator state = statesQ.begin(); state != statesQ.end(); ++state) {
        if (isEndState(*state)) {
            graph.addNode(Node((*state)->getName(), (*state)->getName(), "doublecircle"));
        } else {
            graph.addNode(Node((*state)->getName(), (*state)->getName(), "circle"));
        }
    }

    for (vector<Transition *>::iterator connection = transitionFunctionD.begin();
         connection != transitionFunctionD.end(); ++connection) {
        std::string connectionString =
                "\"(" + toString((*connection)->getInput()) + ", " + (*connection)->getStackInput() +
                "/" +
                toString((*connection)->getStackPush()) + ")\"";
        graph.addConnection(Connection((*connection)->getStateFrom()->getName(), (*connection)->getStateTo()->getName(),
                                       connectionString));
    }

    graph.addNode(Node("invis", "invis", "circle", "style=invis"));
    graph.addConnection(Connection("invis", startState->getName(), "Start"));
    graph.build_file(filename);
}